

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-train.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined8 *in_RSI;
  int in_EDI;
  ggml_opt_dataset_t in_stack_00000050;
  string *in_stack_00000058;
  mnist_model model;
  ggml_opt_dataset_t dataset;
  ggml_opt_dataset_t in_stack_00000350;
  string *in_stack_00000358;
  int in_stack_00002648;
  int in_stack_0000264c;
  string *in_stack_00002650;
  string *in_stack_00002658;
  char *pcVar4;
  mnist_model *this;
  mnist_model *model_00;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  char *in_stack_fffffffffffffe18;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  mnist_model *in_stack_fffffffffffffe70;
  allocator<char> local_169;
  string local_168 [160];
  string *in_stack_ffffffffffffff38;
  mnist_model *in_stack_ffffffffffffff40;
  undefined1 local_71 [56];
  allocator<char> local_39;
  string local_38 [32];
  undefined8 local_18;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if ((in_EDI != 5) && (in_EDI != 6)) {
    fprintf(_stderr,
            "Usage: %s mnist-fc mnist-fc-f32.gguf data/MNIST/raw/train-images-idx3-ubyte data/MNIST/raw/train-labels-idx1-ubyte [CPU/CUDA0]\n"
            ,*in_RSI);
    exit(0);
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_18 = ggml_opt_dataset_init(0x310,10,60000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe17,
                      CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)));
  bVar1 = mnist_image_load(in_stack_00000358,in_stack_00000350);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __s = (char *)local_10[4];
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,__s,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe17,
                        CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)));
    uVar2 = mnist_label_load(in_stack_00000058,in_stack_00000050);
    bVar3 = uVar2 ^ 0xff;
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    if ((bVar3 & 1) == 0) {
      this = (mnist_model *)local_10[1];
      model_00 = (mnist_model *)&local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,__s,
                 (allocator<char> *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe10)));
      if (local_8 < 6) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)local_10[5];
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,__s,
                 (allocator<char> *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe10)));
      mnist_model_init_random
                (in_stack_00002658,in_stack_00002650,in_stack_0000264c,in_stack_00002648);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      mnist_model_build(in_stack_fffffffffffffe70);
      mnist_model_train(model_00,(ggml_opt_dataset_t)this,(int)((ulong)pcVar4 >> 0x20),
                        SUB84(pcVar4,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,__s,
                 (allocator<char> *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe10)));
      mnist_model_save(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      mnist_model::~mnist_model(this);
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc != 5 && argc != 6) {
        fprintf(stderr, "Usage: %s mnist-fc mnist-fc-f32.gguf data/MNIST/raw/train-images-idx3-ubyte data/MNIST/raw/train-labels-idx1-ubyte [CPU/CUDA0]\n", argv[0]);
        exit(0);
    }

    // The MNIST model is so small that the overhead from data shuffling is non-negligible, especially with CUDA.
    // With a shard size of 10 this overhead is greatly reduced at the cost of less shuffling (does not seem to have a significant impact).
    // A batch of 500 images then consists of 50 random shards of size 10 instead of 500 random shards of size 1.
    ggml_opt_dataset_t dataset = ggml_opt_dataset_init(MNIST_NINPUT, MNIST_NCLASSES, MNIST_NTRAIN, /*ndata_shard =*/ 10);

    if (!mnist_image_load(argv[3], dataset)) {
        return 1;
    }
    if (!mnist_label_load(argv[4], dataset)) {
        return 1;
    }

    mnist_model model = mnist_model_init_random(argv[1], argc >= 6 ? argv[5] : "", MNIST_NBATCH_LOGICAL, MNIST_NBATCH_PHYSICAL);

    mnist_model_build(model);

    mnist_model_train(model, dataset, /*nepoch =*/ 30, /*val_split =*/ 0.05f);

    mnist_model_save(model, argv[2]);
}